

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hex.c
# Opt level: O2

_Bool char_to_hex(uchar *val,char c)

{
  byte bVar1;
  
  bVar1 = c - 0x30;
  if (9 < bVar1) {
    if ((byte)(c + 0x9fU) < 6) {
      bVar1 = c + 0xa9;
    }
    else {
      if (5 < (byte)(c + 0xbfU)) {
        return false;
      }
      bVar1 = c - 0x37;
    }
  }
  *val = bVar1;
  return true;
}

Assistant:

static bool char_to_hex(unsigned char *val, char c)
{
	if (c >= '0' && c <= '9') {
		*val = c - '0';
		return true;
	}
	if (c >= 'a' && c <= 'f') {
		*val = c - 'a' + 10;
		return true;
	}
	if (c >= 'A' && c <= 'F') {
		*val = c - 'A' + 10;
		return true;
	}
	return false;
}